

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildAuxNoReg(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  OpLayoutAuxNoReg *pOVar4;
  JITTimeFunctionBody *pJVar5;
  RegOpnd *src1Opnd_00;
  RegOpnd *pRVar6;
  AddrOpnd *src1Opnd_01;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  Opnd *pOVar9;
  HelperCallOpnd *newSrc;
  undefined4 *puVar10;
  HelperCallOpnd *helperOpnd;
  Opnd *src3Opnd;
  Opnd *src2Opnd;
  Opnd *src1Opnd;
  OpLayoutAuxNoReg *auxInsn;
  Instr *instr;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1425,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pOVar4 = Js::ByteCodeReader::AuxNoReg(&this->m_jnReader);
  if (newOpcode != InitCachedFuncs) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x144a,"((0))","Unknown AuxNoReg opcode");
    if (bVar2) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
  src1Opnd_00 = BuildSrcOpnd(this,RVar3,TyVar);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar5);
  pRVar6 = BuildSrcOpnd(this,RVar3,TyVar);
  src1Opnd_01 = BuildAuxArrayOpnd(this,AuxFuncInfoArray,pOVar4->Offset);
  pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar8 = IR::Instr::New(ArgOut_A,&pRVar7->super_Opnd,&src1Opnd_01->super_Opnd,this->m_func);
  AddInstr(this,pIVar8,offset);
  pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar9 = IR::Instr::GetDst(pIVar8);
  pIVar8 = IR::Instr::New(ArgOut_A,&pRVar7->super_Opnd,&pRVar6->super_Opnd,pOVar9,this->m_func);
  AddInstr(this,pIVar8,0xffffffff);
  pRVar6 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar9 = IR::Instr::GetDst(pIVar8);
  pIVar8 = IR::Instr::New(ArgOut_A,&pRVar6->super_Opnd,&src1Opnd_00->super_Opnd,pOVar9,this->m_func)
  ;
  AddInstr(this,pIVar8,0xffffffff);
  newSrc = IR::HelperCallOpnd::New(HelperOP_InitCachedFuncs,this->m_func);
  pOVar9 = IR::Instr::GetDst(pIVar8);
  pIVar8 = IR::Instr::New(CallHelper,this->m_func);
  IR::Instr::SetSrc1(pIVar8,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(pIVar8,pOVar9);
  AddInstr(this,pIVar8,0xffffffff);
  return;
}

Assistant:

void
IRBuilder::BuildAuxNoReg(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr * instr;
    const unaligned Js::OpLayoutAuxNoReg *auxInsn = m_jnReader.AuxNoReg();

    switch (newOpcode)
    {
        case Js::OpCode::InitCachedFuncs:
        {
            IR::Opnd   *src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());
            IR::Opnd   *src2Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg());
            IR::Opnd   *src3Opnd = this->BuildAuxArrayOpnd(AuxArrayValue::AuxFuncInfoArray, auxInsn->Offset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, m_func);
            this->AddInstr(instr, offset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            IR::HelperCallOpnd *helperOpnd;

            helperOpnd = IR::HelperCallOpnd::New(IR::HelperOP_InitCachedFuncs, this->m_func);
            src2Opnd = instr->GetDst();

            instr = IR::Instr::New(Js::OpCode::CallHelper, m_func);
            instr->SetSrc1(helperOpnd);
            instr->SetSrc2(src2Opnd);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            return;
        }

        default:
        {
            AssertMsg(UNREACHED, "Unknown AuxNoReg opcode");
            Fatal();
            break;
        }
    }
}